

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

int DBGSetProcessAttached(CPalThread *pThread,HANDLE hProcess,BOOL bAttach)

{
  long in_FS_OFFSET;
  int local_54;
  long lStack_50;
  int ret;
  CProcProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pobjProcess;
  PAL_ERROR palError;
  BOOL bAttach_local;
  HANDLE hProcess_local;
  CPalThread *pThread_local;
  CAllowedObjectTypes aotProcess;
  
  aotProcess.m_rgfAllowedTypes._2_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pobjProcess._0_4_ = 0;
  pDataLock = (IDataLock *)0x0;
  pLocalData = (CProcProcessLocalData *)0x0;
  lStack_50 = 0;
  local_54 = -1;
  pobjProcess._4_4_ = bAttach;
  _palError = hProcess;
  hProcess_local = pThread;
  CorUnix::CAllowedObjectTypes::CAllowedObjectTypes
            ((CAllowedObjectTypes *)((long)&pThread_local + 6),otiProcess);
  pobjProcess._0_4_ =
       (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                 (CorUnix::g_pObjectManager,hProcess_local,_palError,
                  (CAllowedObjectTypes *)((long)&pThread_local + 6),0,&pDataLock);
  if (((int)pobjProcess == 0) &&
     (pobjProcess._0_4_ =
           (*pDataLock->_vptr_IDataLock[3])
                     (pDataLock,hProcess_local,1,&pLocalData,&stack0xffffffffffffffb0),
     (int)pobjProcess == 0)) {
    if (pobjProcess._4_4_ == 0) {
      *(int *)(lStack_50 + 0xc) = *(int *)(lStack_50 + 0xc) + -1;
      if (*(int *)(lStack_50 + 0xc) < 0) {
        fprintf(_stderr,"] %s %s:%d","DBGSetProcessAttached",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                ,0x61c);
        fprintf(_stderr,"pLocalData->lAttachCount < 0 check for extra DBGDetachProcess calls\n");
        pobjProcess._0_4_ = 0x54f;
        goto LAB_003aa54a;
      }
    }
    else {
      *(int *)(lStack_50 + 0xc) = *(int *)(lStack_50 + 0xc) + 1;
    }
    local_54 = *(int *)(lStack_50 + 0xc);
  }
LAB_003aa54a:
  if (pLocalData != (CProcProcessLocalData *)0x0) {
    (*(code *)**(undefined8 **)pLocalData)(pLocalData,hProcess_local,1);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,hProcess_local);
  }
  CorUnix::CAllowedObjectTypes::~CAllowedObjectTypes
            ((CAllowedObjectTypes *)((long)&pThread_local + 6));
  if (*(long *)(in_FS_OFFSET + 0x28) != aotProcess.m_rgfAllowedTypes._2_8_) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int
DBGSetProcessAttached(
    CPalThread *pThread,
    HANDLE hProcess,
    BOOL  bAttach
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock = NULL;
    CProcProcessLocalData *pLocalData = NULL;
    int ret = -1;
    CAllowedObjectTypes aotProcess(otiProcess);

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto DBGSetProcessAttachedExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto DBGSetProcessAttachedExit;
    }

    if (bAttach)
    {
        pLocalData->lAttachCount += 1;
    }
    else
    {
        pLocalData->lAttachCount -= 1;

        if (pLocalData->lAttachCount < 0)
        {
            ASSERT("pLocalData->lAttachCount < 0 check for extra DBGDetachProcess calls\n");
            palError = ERROR_INTERNAL_ERROR;
            goto DBGSetProcessAttachedExit;
        }
    }

    ret = pLocalData->lAttachCount;

DBGSetProcessAttachedExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, TRUE);
    }

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return ret;
}